

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinystr.cpp
# Opt level: O1

TiXmlString operator+(TiXmlString *a,TiXmlString *b)

{
  long *in_RDX;
  
  a->rep_ = &TiXmlString::nullrep_;
  TiXmlString::reserve(a,*(long *)*in_RDX + b->rep_->size);
  TiXmlString::append(a,b->rep_->str,b->rep_->size);
  TiXmlString::append(a,(char *)((size_type *)*in_RDX + 2),*(size_type *)*in_RDX);
  return (TiXmlString)(Rep *)a;
}

Assistant:

TiXmlString operator + (const TiXmlString & a, const TiXmlString & b)
{
	TiXmlString tmp;
	tmp.reserve(a.length() + b.length());
	tmp += a;
	tmp += b;
	return tmp;
}